

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::basic_format<wchar_t>::add(basic_format<wchar_t> *this,formattible_type *param)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->parameters_count_;
  uVar2 = (ulong)uVar1;
  if (uVar2 < 8) {
    if (this->parameters_ + uVar2 != param) {
      this->parameters_[uVar2].pointer_ = param->pointer_;
      this->parameters_[uVar2].writer_ = param->writer_;
    }
  }
  else {
    std::
    vector<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
    ::push_back(&this->ext_params_,param);
    uVar1 = this->parameters_count_;
  }
  this->parameters_count_ = uVar1 + 1;
  return;
}

Assistant:

void add(formattible_type const &param)
            {
                if(parameters_count_ >= base_params_)
                    ext_params_.push_back(param);
                else 
                    parameters_[parameters_count_] = param;
                parameters_count_++;
            }